

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_boolean_test.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::TransformBooleanTestInternal
          (duckdb *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *argument,ExpressionType comparison_type,bool comparison_value,int query_location)

{
  type expr;
  type expr_00;
  ExpressionType local_71;
  __uniq_ptr_impl<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>_>
  local_70;
  _Head_base<0UL,_duckdb::ComparisonExpression_*,_false> local_68;
  long *local_60 [8];
  
  local_71 = comparison_type;
  Value::BOOLEAN((Value *)local_60,comparison_value);
  make_uniq<duckdb::ConstantExpression,duckdb::Value>((duckdb *)&local_70,(Value *)local_60);
  Value::~Value((Value *)local_60);
  expr = unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
         ::operator*((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                      *)&local_70);
  Transformer::SetQueryLocation(&expr->super_ParsedExpression,query_location);
  make_uniq<duckdb::CastExpression,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((duckdb *)local_60,&LogicalType::BOOLEAN,argument);
  make_uniq<duckdb::ComparisonExpression,duckdb::ExpressionType&,duckdb::unique_ptr<duckdb::CastExpression,std::default_delete<duckdb::CastExpression>,true>,duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
            ((duckdb *)&local_68,&local_71,
             (unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>
              *)local_60,
             (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
              *)&local_70);
  expr_00 = unique_ptr<duckdb::ComparisonExpression,_std::default_delete<duckdb::ComparisonExpression>,_true>
            ::operator*((unique_ptr<duckdb::ComparisonExpression,_std::default_delete<duckdb::ComparisonExpression>,_true>
                         *)&local_68);
  Transformer::SetQueryLocation(&expr_00->super_ParsedExpression,query_location);
  *(ComparisonExpression **)this = local_68._M_head_impl;
  if ((tuple<duckdb::CastExpression_*,_std::default_delete<duckdb::CastExpression>_>)local_60[0] !=
      (_Head_base<0UL,_duckdb::CastExpression_*,_false>)0x0) {
    (**(code **)(*local_60[0] + 8))();
  }
  if (local_70._M_t.
      super__Tuple_impl<0UL,_duckdb::ConstantExpression_*,_std::default_delete<duckdb::ConstantExpression>_>
      .super__Head_base<0UL,_duckdb::ConstantExpression_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_duckdb::ConstantExpression_*,_std::default_delete<duckdb::ConstantExpression>_>
       )0x0) {
    (**(code **)(*(long *)local_70._M_t.
                          super__Tuple_impl<0UL,_duckdb::ConstantExpression_*,_std::default_delete<duckdb::ConstantExpression>_>
                          .super__Head_base<0UL,_duckdb::ConstantExpression_*,_false>._M_head_impl +
                8))();
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

static unique_ptr<ParsedExpression> TransformBooleanTestInternal(unique_ptr<ParsedExpression> argument,
                                                                 ExpressionType comparison_type, bool comparison_value,
                                                                 int query_location) {
	auto bool_value = make_uniq<ConstantExpression>(Value::BOOLEAN(comparison_value));
	Transformer::SetQueryLocation(*bool_value, query_location);
	// we cast the argument to bool to remove ambiguity wrt function binding on the comparison
	auto cast_argument = make_uniq<CastExpression>(LogicalType::BOOLEAN, std::move(argument));

	auto result = make_uniq<ComparisonExpression>(comparison_type, std::move(cast_argument), std::move(bool_value));
	Transformer::SetQueryLocation(*result, query_location);
	return std::move(result);
}